

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O3

_Bool xdr_reply_encode(XDR *xdrs,rpc_msg *dmsg)

{
  reply_body *__dscmp;
  anon_union_432_2_d8689e7e_for_ru *__unp;
  reply_stat rVar1;
  uint uVar2;
  msg_type mVar3;
  _Bool _Var4;
  bool_t bVar5;
  uint *puVar6;
  ulong uVar7;
  uint *puVar8;
  xdr_discrim *__choices;
  uint *puVar9;
  undefined8 uVar10;
  accept_stat aVar11;
  char *pcVar12;
  xdrproc_t in_R8;
  uint *puVar13;
  
  __dscmp = &(dmsg->ru).RM_rmb;
  rVar1 = (dmsg->ru).RM_rmb.rp_stat;
  uVar7 = (ulong)rVar1;
  if (rVar1 != MSG_DENIED) {
    if (rVar1 == MSG_ACCEPTED) {
      uVar2 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
      if (400 < (ulong)uVar2) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        (*__ntirpc_pkg_params.warnx_)
                  ("%s:%u ERROR ar_verf.oa_length (%u) > %u","xdr_reply_encode",0x52,(ulong)uVar2,
                   400);
        return false;
      }
      __unp = &(dmsg->ru).RM_rmb.ru;
      puVar13 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
      puVar9 = (uint *)((long)puVar13 + (ulong)(uVar2 + 3 & 0x3fc) + 0x18);
      puVar8 = puVar13;
      if (puVar9 <= puVar6) {
        xdrs->x_data = (uint8_t *)puVar9;
        if ((xdrs->x_v).vio_tail < puVar9) {
          (xdrs->x_v).vio_tail = (uint8_t *)puVar9;
          *(uint **)((long)xdrs->x_base + 0x10) = puVar9;
        }
        puVar8 = puVar9;
        if (puVar13 != (uint *)0x0) {
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED INLINE","xdr_reply_encode",0x5d);
          }
          uVar2 = dmsg->rm_xid;
          *puVar13 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
          ;
          mVar3 = dmsg->rm_direction;
          puVar13[1] = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 |
                       mVar3 << 0x18;
          rVar1 = (dmsg->ru).RM_rmb.rp_stat;
          puVar13[2] = rVar1 >> 0x18 | (rVar1 & 0xff0000) >> 8 | (rVar1 & 0xff00) << 8 |
                       rVar1 << 0x18;
          uVar2 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_flavor;
          puVar13[3] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
          uVar2 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
          puVar13[4] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
          puVar13 = puVar13 + 5;
          uVar7 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
          if (uVar7 != 0) {
            memcpy(puVar13,(void *)((long)&(dmsg->ru).RM_rmb.ru + 0x20),uVar7);
            puVar13 = (uint *)((long)puVar13 +
                              (ulong)((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length + 3 & 0xfffffffc)
                              );
          }
          aVar11 = (__unp->RP_ar).ar_stat;
          *puVar13 = aVar11 >> 0x18 | (aVar11 & 0xff0000) >> 8 | (aVar11 & 0xff00) << 8 |
                     aVar11 << 0x18;
          if ((__unp->RP_ar).ar_stat != PROG_MISMATCH) {
            if ((__unp->RP_ar).ar_stat != SUCCESS) {
              return true;
            }
            if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
              (*__ntirpc_pkg_params.warnx_)("%s:%u SUCCESS","xdr_reply_encode",0x6d);
              return true;
            }
            return true;
          }
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_encode",0x73);
          }
          puVar8 = (uint *)xdrs->x_data;
          puVar6 = (uint *)(xdrs->x_v).vio_wrap;
          puVar13 = puVar8 + 2;
          puVar9 = puVar8;
          if (puVar13 <= puVar6) {
            xdrs->x_data = (uint8_t *)puVar13;
            if ((xdrs->x_v).vio_tail < puVar13) {
              (xdrs->x_v).vio_tail = (uint8_t *)puVar13;
              *(uint **)((long)xdrs->x_base + 0x10) = puVar13;
            }
            puVar9 = puVar13;
            if (puVar8 != (uint *)0x0) {
              uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
              *puVar8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18;
              uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
              puVar8[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18;
              return true;
            }
          }
          uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
          puVar13 = puVar9 + 1;
          if (puVar6 < puVar13) {
            _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
            if (!_Var4) {
              if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
                return false;
              }
              uVar7 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
              pcVar12 = "%s:%u ERROR ar_vers.low %u";
              uVar10 = 0x7d;
              goto LAB_001127f5;
            }
            puVar13 = (uint *)xdrs->x_data;
            puVar6 = (uint *)(xdrs->x_v).vio_wrap;
          }
          else {
            *puVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
            xdrs->x_data = (uint8_t *)puVar13;
          }
          uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
          if (puVar13 + 1 <= puVar6) {
            *puVar13 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
            xdrs->x_data = (uint8_t *)(puVar13 + 1);
            return true;
          }
          _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
          if (_Var4) {
            return true;
          }
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          uVar7 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
          pcVar12 = "%s:%u ERROR ar_vers.high %u";
          uVar10 = 0x84;
          goto LAB_001127f5;
        }
      }
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED non-INLINE","xdr_reply_encode",0x94);
        puVar8 = (uint *)xdrs->x_data;
        puVar6 = (uint *)(xdrs->x_v).vio_wrap;
      }
      uVar2 = dmsg->rm_xid;
      puVar13 = puVar8 + 1;
      if (puVar6 < puVar13) {
        _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
        if (!_Var4) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          mVar3 = dmsg->rm_xid;
          pcVar12 = "%s:%u ERROR rm_xid %u";
          uVar10 = 0x98;
          goto LAB_00112980;
        }
        puVar13 = (uint *)xdrs->x_data;
        puVar6 = (uint *)(xdrs->x_v).vio_wrap;
      }
      else {
        *puVar8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        xdrs->x_data = (uint8_t *)puVar13;
      }
      mVar3 = dmsg->rm_direction;
      __choices = (xdr_discrim *)(puVar13 + 1);
      if (puVar6 < __choices) {
        _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,mVar3);
        if (!_Var4) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          mVar3 = dmsg->rm_direction;
          pcVar12 = "%s:%u ERROR rm_direction %u";
          uVar10 = 0x9f;
LAB_00112980:
          (*__ntirpc_pkg_params.warnx_)(pcVar12,"xdr_reply_encode",uVar10,(ulong)mVar3);
          return false;
        }
      }
      else {
        *puVar13 = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
        xdrs->x_data = (uint8_t *)__choices;
      }
      bVar5 = xdr_union((XDR *)xdrs,(enum_t *)__dscmp,(char *)__unp,__choices,in_R8);
      if ((char)bVar5 != '\0') {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR inline_xdr_union","xdr_reply_encode",0xa9);
      return false;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    pcVar12 = "%s:%u ERROR dmsg->rm_reply.rp_stat (%u)";
    uVar10 = 0x10e;
    goto LAB_00112574;
  }
  puVar8 = (uint *)xdrs->x_data;
  puVar6 = (uint *)(xdrs->x_v).vio_wrap;
  puVar13 = puVar8 + 3;
  puVar9 = puVar8;
  if (puVar6 < puVar13) {
LAB_00112539:
    uVar2 = dmsg->rm_xid;
    puVar13 = puVar9 + 1;
    if (puVar6 < puVar13) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (!_Var4) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar7 = (ulong)dmsg->rm_xid;
        pcVar12 = "%s:%u ERROR rm_xid %u";
        uVar10 = 0xbb;
        goto LAB_00112574;
      }
      puVar13 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar13;
    }
    mVar3 = dmsg->rm_direction;
    puVar8 = puVar13 + 1;
    if (puVar6 < puVar8) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,mVar3);
      if (!_Var4) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar7 = (ulong)dmsg->rm_direction;
        pcVar12 = "%s:%u ERROR rm_direction %u";
        uVar10 = 0xc1;
        goto LAB_00112574;
      }
      puVar8 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar13 = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
      xdrs->x_data = (uint8_t *)puVar8;
    }
    rVar1 = __dscmp->rp_stat;
    if (puVar6 < puVar8 + 1) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,rVar1);
      if (!_Var4) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar7 = (ulong)__dscmp->rp_stat;
        pcVar12 = "%s:%u ERROR rp_stat %u";
        uVar10 = 199;
LAB_00112574:
        (*__ntirpc_pkg_params.warnx_)(pcVar12,"xdr_reply_encode",uVar10,uVar7);
        return false;
      }
    }
    else {
      *puVar8 = rVar1 >> 0x18 | (rVar1 & 0xff0000) >> 8 | (rVar1 & 0xff00) << 8 | rVar1 << 0x18;
      xdrs->x_data = (uint8_t *)(puVar8 + 1);
    }
  }
  else {
    xdrs->x_data = (uint8_t *)puVar13;
    if ((xdrs->x_v).vio_tail < puVar13) {
      (xdrs->x_v).vio_tail = (uint8_t *)puVar13;
      *(uint **)((long)xdrs->x_base + 0x10) = puVar13;
    }
    puVar9 = puVar13;
    if (puVar8 == (uint *)0x0) goto LAB_00112539;
    uVar2 = dmsg->rm_xid;
    *puVar8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    mVar3 = dmsg->rm_direction;
    puVar8[1] = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
    rVar1 = (dmsg->ru).RM_rmb.rp_stat;
    puVar8[2] = rVar1 >> 0x18 | (rVar1 & 0xff0000) >> 8 | (rVar1 & 0xff00) << 8 | rVar1 << 0x18;
  }
  aVar11 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
  uVar7 = (ulong)aVar11;
  if (aVar11 == PROG_UNAVAIL) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_encode",0xee);
    }
    puVar8 = (uint *)xdrs->x_data;
    puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    puVar13 = puVar8 + 2;
    if (puVar6 < puVar13) {
      aVar11 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
      puVar13 = puVar8;
    }
    else {
      xdrs->x_data = (uint8_t *)puVar13;
      if ((xdrs->x_v).vio_tail < puVar13) {
        (xdrs->x_v).vio_tail = (uint8_t *)puVar13;
        *(uint **)((long)xdrs->x_base + 0x10) = puVar13;
      }
      aVar11 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
      if (puVar8 != (uint *)0x0) {
        *puVar8 = aVar11 >> 0x18 | (aVar11 & 0xff0000) >> 8 | (aVar11 & 0xff00) << 8 |
                  aVar11 << 0x18;
        uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
        puVar8[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        return true;
      }
    }
    puVar8 = puVar13 + 1;
    if (puVar6 < puVar8) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,aVar11);
      if (!_Var4) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar7 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
        pcVar12 = "%s:%u ERROR rj_stat %u";
        uVar10 = 0xf7;
        goto LAB_001127f5;
      }
      puVar8 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar13 = aVar11 >> 0x18 | (aVar11 & 0xff0000) >> 8 | (aVar11 & 0xff00) << 8 | aVar11 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar8;
    }
    uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
    if (puVar8 + 1 <= puVar6) {
      *puVar8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)(puVar8 + 1);
      return true;
    }
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
    if (_Var4) {
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      uVar7 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
      pcVar12 = "%s:%u ERROR rj_why %u";
      uVar10 = 0xfd;
      goto LAB_001127f5;
    }
  }
  else if (aVar11 == SUCCESS) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_encode",0xd0);
    }
    puVar8 = (uint *)xdrs->x_data;
    puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    puVar13 = puVar8 + 3;
    if (puVar6 < puVar13) {
      aVar11 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
      puVar13 = puVar8;
    }
    else {
      xdrs->x_data = (uint8_t *)puVar13;
      if ((xdrs->x_v).vio_tail < puVar13) {
        (xdrs->x_v).vio_tail = (uint8_t *)puVar13;
        *(uint **)((long)xdrs->x_base + 0x10) = puVar13;
      }
      aVar11 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
      if (puVar8 != (uint *)0x0) {
        *puVar8 = aVar11 >> 0x18 | (aVar11 & 0xff0000) >> 8 | (aVar11 & 0xff00) << 8 |
                  aVar11 << 0x18;
        uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
        puVar8[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
        puVar8[2] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        return true;
      }
    }
    puVar8 = puVar13 + 1;
    if (puVar6 < puVar8) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,aVar11);
      if (!_Var4) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar7 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
        pcVar12 = "%s:%u ERROR rj_stat %u";
        uVar10 = 0xda;
        goto LAB_001127f5;
      }
      puVar8 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar13 = aVar11 >> 0x18 | (aVar11 & 0xff0000) >> 8 | (aVar11 & 0xff00) << 8 | aVar11 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar8;
    }
    uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
    puVar13 = puVar8 + 1;
    if (puVar6 < puVar13) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (!_Var4) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar7 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
        pcVar12 = "%s:%u ERROR rj_vers.low %u";
        uVar10 = 0xe0;
        goto LAB_001127f5;
      }
      puVar13 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar13;
    }
    uVar2 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
    if (puVar13 + 1 <= puVar6) {
      *puVar13 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)(puVar13 + 1);
      return true;
    }
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
    if (_Var4) {
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      uVar7 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
      pcVar12 = "%s:%u ERROR rj_vers.high %u";
      uVar10 = 0xe6;
LAB_001127f5:
      (*__ntirpc_pkg_params.warnx_)(pcVar12,"xdr_reply_encode",uVar10,uVar7);
      return false;
    }
  }
  else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
    pcVar12 = "%s:%u ERROR rr->rj_stat (%u)";
    uVar10 = 0x105;
    goto LAB_001127f5;
  }
  return false;
}

Assistant:

bool
xdr_reply_encode(XDR *xdrs, struct rpc_msg *dmsg)
{
	struct opaque_auth *oa;
	int32_t *buf;

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		oa = &ar->ar_verf;
		if (oa->oa_length > MAX_AUTH_BYTES) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_verf.oa_length (%u) > %u",
				__func__, __LINE__,
				oa->oa_length,
				MAX_AUTH_BYTES);
			return (false);
		}
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT
						+ RNDUP(oa->oa_length));

		if (buf != NULL) {
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u ACCEPTED INLINE",
				__func__, __LINE__);
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
			IXDR_PUT_ENUM(buf, oa->oa_flavor);
			IXDR_PUT_INT32(buf, oa->oa_length);
			if (oa->oa_length) {
				memcpy(buf, oa->oa_body, oa->oa_length);
				buf += RNDUP(oa->oa_length) / sizeof(int32_t);
			}

			IXDR_PUT_ENUM(buf, ar->ar_stat);
			switch (ar->ar_stat) {
			case SUCCESS:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u SUCCESS",
					__func__, __LINE__);
				return (true);

			case PROG_MISMATCH:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u MISMATCH",
					__func__, __LINE__);
				buf = xdr_inline_encode(xdrs,
							2 * BYTES_PER_XDR_UNIT);
				if (buf != NULL) {
					IXDR_PUT_ENUM(buf, ar->ar_vers.low);
					IXDR_PUT_ENUM(buf, ar->ar_vers.high);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.low)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.low %u",
						__func__, __LINE__,
						ar->ar_vers.low);
					return (false);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.high)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.high %u",
						__func__, __LINE__,
						ar->ar_vers.high);
					return (false);
				}
				/* fallthru */
			case GARBAGE_ARGS:
			case SYSTEM_ERR:
			case PROC_UNAVAIL:
			case PROG_UNAVAIL:
				break;
			};
			return (true);
		}

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u ACCEPTED non-INLINE",
			__func__, __LINE__);
		if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		}
		if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		}
		if (!inline_xdr_union(xdrs,
				      (enum_t *) &(dmsg->rm_reply.rp_stat),
				      (void *)&(dmsg->rm_reply.ru),
				      reply_dscrm, NULL_xdrproc_t)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR inline_xdr_union",
				__func__, __LINE__);
			return (false);
		}
		return (true);
	}
	case MSG_DENIED:
	{
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
		} else if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_reply.rp_stat)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rp_stat %u",
				__func__, __LINE__,
				dmsg->rm_reply.rp_stat);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.low);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.high);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.low)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low %u",
					__func__, __LINE__,
					rr->rj_vers.low);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.high)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high %u",
					__func__, __LINE__,
					rr->rj_vers.high);
				return (false);
			}
			return (true); /* bugfix */
		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 2 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_ENUM(buf, rr->rj_why);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putenum(xdrs, rr->rj_why)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why %u",
					__func__, __LINE__,
					rr->rj_why);
				return (false);
			}
			return (true); /* bugfix */
		default:
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rr->rj_stat (%u)",
				__func__, __LINE__,
				rr->rj_stat);
			break;
		};
		break;
	}
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat (%u)",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};

	return (false);
}